

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_toplex_map_unit_test.cpp
# Opt level: O0

void toplex_map_empty_toplex_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8d1;
  basic_wrap_stringstream<char> local_8d0;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  char local_711;
  basic_wrap_stringstream<char> local_710;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  char local_551;
  basic_wrap_stringstream<char> local_550;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  char local_391;
  basic_wrap_stringstream<char> local_390;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  toplex_map_empty_toplex local_1d5 [8];
  toplex_map_empty_toplex t;
  char local_1c1;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Toplex_map/test/lazy_toplex_map_unit_test.cpp"
             ,0x77);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  local_1c1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_1c1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [24])"toplex_map_empty_toplex");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_18,0x57,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Toplex_map/test/lazy_toplex_map_unit_test.cpp"
             ,0x77);
  memset(&local_390,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_390);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_390);
  local_391 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_391);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [24])"toplex_map_empty_toplex");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x57,&local_1f8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_390);
  boost::unit_test::setup_conditional<toplex_map_empty_toplex>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Toplex_map/test/lazy_toplex_map_unit_test.cpp"
             ,0x77);
  memset(&local_550,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_550);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_550);
  local_551 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_551);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [24])"toplex_map_empty_toplex");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a8,0x57,&local_3b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_550);
  toplex_map_empty_toplex::test_method(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_568,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Toplex_map/test/lazy_toplex_map_unit_test.cpp"
             ,0x77);
  memset(&local_710,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_710);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_710);
  local_711 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_711);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [24])"toplex_map_empty_toplex");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_578,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_568,0x57,&local_578);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_710);
  boost::unit_test::teardown_conditional<toplex_map_empty_toplex>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_728,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Toplex_map/test/lazy_toplex_map_unit_test.cpp"
             ,0x77);
  memset(&local_8d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8d0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8d0);
  local_8d1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8d1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [24])"toplex_map_empty_toplex");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_738,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_728,0x57,&local_738);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(toplex_map_empty_toplex) {
  using Vertex = Gudhi::Lazy_toplex_map::Vertex;

  Gudhi::Lazy_toplex_map tm;
  std::clog << "num_maximal_simplices = " << tm.num_maximal_simplices() << std::endl;
  BOOST_CHECK(tm.num_maximal_simplices() == 0);
  std::clog << "num_vertices = " << tm.num_vertices() << std::endl;
  BOOST_CHECK(tm.num_vertices() == 0);

  std::clog << "Check an empty simplex is a member." << std::endl;
  std::vector<Vertex> empty_sigma = {};
  BOOST_CHECK(tm.membership(empty_sigma));

  std::clog << "Check the edge 2,7 is not a member." << std::endl;
  std::vector<Vertex> edge = {2, 7};
  BOOST_CHECK(!tm.membership(edge));

  std::clog << "Insert an empty simplex." << std::endl;
  tm.insert_simplex(empty_sigma);

  std::clog << "num_maximal_simplices = " << tm.num_maximal_simplices() << std::endl;
  BOOST_CHECK(tm.num_maximal_simplices() == 0);
  std::clog << "num_vertices = " << tm.num_vertices() << std::endl;
  BOOST_CHECK(tm.num_vertices() == 0);

  std::clog << "Check an empty simplex is a member." << std::endl;
  BOOST_CHECK(tm.membership(empty_sigma));
  std::clog << "Check the edge 2,7 is not a member." << std::endl;
  BOOST_CHECK(!tm.membership(edge));

  std::clog << "Insert edge 2,7." << std::endl;
  tm.insert_simplex(edge);

  std::clog << "num_maximal_simplices = " << tm.num_maximal_simplices() << std::endl;
  BOOST_CHECK(tm.num_maximal_simplices() == 1);
  std::clog << "num_vertices = " << tm.num_vertices() << std::endl;
  BOOST_CHECK(tm.num_vertices() == 2);

  std::clog << "Check an empty simplex is a member." << std::endl;
  BOOST_CHECK(tm.membership(empty_sigma));
  std::clog << "Check the edge 2,7 is a member." << std::endl;
  BOOST_CHECK(tm.membership(edge));

  std::clog << "contraction(2,7)" << std::endl;
  auto r = tm.contraction(2, 7);
  std::clog << "r=" << r << std::endl;
  BOOST_CHECK(r == 7);

  std::clog << "num_maximal_simplices = " << tm.num_maximal_simplices() << std::endl;
  BOOST_CHECK(tm.num_maximal_simplices() == 1);
  std::clog << "num_vertices = " << tm.num_vertices() << std::endl;
  BOOST_CHECK(tm.num_vertices() == 1);

  std::clog << "Check an empty simplex is a member." << std::endl;
  BOOST_CHECK(tm.membership(empty_sigma));
  std::clog << "Check the edge 2,7 is not a member." << std::endl;
  BOOST_CHECK(!tm.membership(edge));

  std::clog << "Remove the vertex 7." << std::endl;
  std::vector<Vertex> vertex = {7};
  tm.remove_simplex(vertex);

  std::clog << "num_maximal_simplices = " << tm.num_maximal_simplices() << std::endl;
  BOOST_CHECK(tm.num_maximal_simplices() == 0);
  std::clog << "num_vertices = " << tm.num_vertices() << std::endl;
  BOOST_CHECK(tm.num_vertices() == 0);

  std::clog << "Check an empty simplex is a member." << std::endl;
  BOOST_CHECK(tm.membership(empty_sigma));
  std::clog << "Check the edge 2,7 is not a member." << std::endl;
  BOOST_CHECK(!tm.membership(edge));
}